

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall spv::Builder::createTriOp(Builder *this,Op opCode,Id typeId,Id op1,Id op2,Id op3)

{
  Vector<Id> *this_00;
  iterator iVar1;
  Block *pBVar2;
  Id IVar3;
  Instruction *instruction;
  Instruction *raw_instruction;
  Vector<Id> operands;
  _Head_base<0UL,_spv::Instruction_*,_false> local_70;
  _Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_68;
  _Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_48;
  
  if (this->generatingOpCodeForSpecConst == true) {
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)::dxil_spv::allocate_in_thread(0xc)
    ;
    local_68._M_impl.super__Vector_impl_data._M_finish =
         local_68._M_impl.super__Vector_impl_data._M_start + 3;
    local_68._M_impl.super__Vector_impl_data._M_start[0] = 0;
    local_68._M_impl.super__Vector_impl_data._M_start[1] = 0;
    local_68._M_impl.super__Vector_impl_data._M_start[2] = 0;
    *local_68._M_impl.super__Vector_impl_data._M_start = op1;
    local_68._M_impl.super__Vector_impl_data._M_start[1] = op2;
    local_68._M_impl.super__Vector_impl_data._M_start[2] = op3;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_68._M_impl.super__Vector_impl_data._M_finish;
    IVar3 = createSpecConstantOp
                      (this,opCode,typeId,(Vector<Id> *)&local_68,(Vector<unsigned_int> *)&local_48)
    ;
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              (&local_48);
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              (&local_68);
  }
  else {
    instruction = (Instruction *)::dxil_spv::allocate_in_thread(0x38);
    IVar3 = this->uniqueId + 1;
    this->uniqueId = IVar3;
    instruction->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f81e0;
    instruction->resultId = IVar3;
    instruction->typeId = typeId;
    instruction->opCode = opCode;
    this_00 = &instruction->operands;
    (instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    instruction->block = (Block *)0x0;
    iVar1._M_current =
         (instruction->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (instruction->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_68._M_impl.super__Vector_impl_data._M_start._0_4_ = op1;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,iVar1,
                 (uint *)&local_68);
    }
    else {
      *iVar1._M_current = op1;
      (instruction->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    iVar1._M_current =
         (instruction->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (instruction->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_68._M_impl.super__Vector_impl_data._M_start._0_4_ = op2;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,iVar1,
                 (uint *)&local_68);
    }
    else {
      *iVar1._M_current = op2;
      (instruction->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    local_68._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_68._M_impl.super__Vector_impl_data._M_start._4_4_,op3);
    iVar1._M_current =
         (instruction->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (instruction->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,iVar1,
                 (uint *)&local_68);
    }
    else {
      *iVar1._M_current = op3;
      (instruction->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    pBVar2 = this->buildPoint;
    local_70._M_head_impl = instruction;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&pBVar2->instructions,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_70);
    instruction->block = pBVar2;
    if (instruction->resultId != 0) {
      Module::mapInstruction(pBVar2->parent->parent,instruction);
    }
    if (local_70._M_head_impl != (Instruction *)0x0) {
      (*(local_70._M_head_impl)->_vptr_Instruction[1])();
    }
    IVar3 = instruction->resultId;
  }
  return IVar3;
}

Assistant:

Id Builder::createTriOp(Op opCode, Id typeId, Id op1, Id op2, Id op3)
{
    // Generate code for spec constants if in spec constant operation
    // generation mode.
    if (generatingOpCodeForSpecConst) {
        dxil_spv::Vector<Id> operands(3);
        operands[0] = op1;
        operands[1] = op2;
        operands[2] = op3;
        return createSpecConstantOp(
            opCode, typeId, operands, dxil_spv::Vector<Id>());
    }
    Instruction* op = new Instruction(getUniqueId(), typeId, opCode);
    op->addIdOperand(op1);
    op->addIdOperand(op2);
    op->addIdOperand(op3);
    buildPoint->addInstruction(std::unique_ptr<Instruction>(op));

    return op->getResultId();
}